

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::TriangleInterpolationTest::iterate
          (TriangleInterpolationTest *this)

{
  pointer pSVar1;
  pointer pVVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  float *pfVar4;
  GLenum GVar5;
  TestLog *log;
  undefined1 auVar6 [16];
  TriangleInterpolationTest *pTVar7;
  undefined1 auVar8 [8];
  bool bVar9;
  int iVar10;
  long *plVar11;
  undefined8 *puVar12;
  RenderTarget *pRVar13;
  pointer pVVar14;
  ulong *puVar15;
  size_type *psVar16;
  char *description;
  IterateResult IVar17;
  undefined8 uVar18;
  pointer pSVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  float fVar24;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  string iterationDescription;
  ScopedLogSection section;
  RasterizationArguments args;
  Vec4 colors [3];
  undefined1 local_288 [24];
  long lStack_270;
  string local_268;
  undefined1 local_248 [40];
  TriangleInterpolationTest *local_220;
  undefined1 local_218 [32];
  string local_1f8;
  ScopedLogSection local_1d8;
  RasterizationArguments local_1cc;
  undefined1 local_1b8 [8];
  pointer apSStack_1b0 [2];
  float afStack_1a0 [4];
  undefined1 *puStack_190;
  float local_188 [2];
  float afStack_180 [2];
  float local_178 [2];
  float afStack_170 [2];
  float local_168 [2];
  float afStack_160 [2];
  bool local_158 [16];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar10 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar10 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x1c06ce9);
  pVVar2 = (pointer)(local_288 + 0x10);
  pVVar14 = (pointer)(plVar11 + 2);
  if ((pointer)*plVar11 == pVVar14) {
    local_288._16_8_ = *(undefined8 *)pVVar14->m_data;
    lStack_270 = plVar11[3];
    local_288._0_8_ = pVVar2;
  }
  else {
    local_288._16_8_ = *(undefined8 *)pVVar14->m_data;
    local_288._0_8_ = (pointer)*plVar11;
  }
  local_288._8_8_ = plVar11[1];
  *plVar11 = (long)pVVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(local_288);
  paVar3 = &local_268.field_2;
  puVar15 = (ulong *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_268.field_2._M_allocated_capacity = *puVar15;
    local_268.field_2._8_8_ = plVar11[3];
    local_268._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.field_2._M_allocated_capacity = *puVar15;
    local_268._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_268._M_string_length = plVar11[1];
  *plVar11 = (long)puVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  pSVar1 = (pointer)((long)((Vec4 *)local_248._8_8_)->m_data + local_268._M_string_length);
  uVar18 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar3) {
    uVar18 = local_268.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < pSVar1) {
    pSVar19 = (pointer)0xf;
    if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
      pSVar19 = (pointer)local_248._16_8_;
    }
    if (pSVar1 <= pSVar19) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_248,0,(char *)0x0,(ulong)local_268._M_dataplus._M_p);
      goto LAB_00f6f7be;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,local_248._0_8_);
LAB_00f6f7be:
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  psVar16 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_1f8.field_2._M_allocated_capacity = *psVar16;
    local_1f8.field_2._8_8_ = puVar12[3];
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *psVar16;
    local_1f8._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_1f8._M_string_length = puVar12[1];
  *puVar12 = psVar16;
  puVar12[1] = 0;
  *(undefined1 *)psVar16 = 0;
  if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)((Vec4 *)local_248._16_8_)->m_data + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar3) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_288._0_8_ != pVVar2) {
    operator_delete((void *)local_288._0_8_,(ulong)((long)(float *)local_288._16_8_ + 1));
  }
  if ((pointer)local_218._0_8_ != (pointer)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_,(ulong)((long)(float *)local_218._16_8_ + 1));
  }
  log = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar10 = this->m_iteration;
  local_220 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,iVar10 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)local_288,0,(char *)0x0,0x1c07054);
  pTVar7 = local_220;
  psVar16 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_268.field_2._M_allocated_capacity = *psVar16;
    local_268.field_2._8_8_ = plVar11[3];
    local_268._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.field_2._M_allocated_capacity = *psVar16;
    local_268._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_268._M_string_length = plVar11[1];
  *plVar11 = (long)psVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1d8,log,&local_268,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar3) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_288._0_8_ != pVVar2) {
    operator_delete((void *)local_288._0_8_,(ulong)((long)(float *)local_288._16_8_ + 1));
  }
  iVar10 = (pTVar7->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface((Surface *)&local_268,iVar10,iVar10);
  local_288._0_8_ = (pointer)0x0;
  local_288._8_8_ = (pointer)0x0;
  local_288._16_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_1b8 = (undefined1  [8])0x3f800000;
  apSStack_1b0[0] = (pointer)0x3f80000000000000;
  apSStack_1b0[1] = (pointer)0x3f80000000000000;
  afStack_1a0[0] = 0.0;
  afStack_1a0[1] = 1.0;
  afStack_1a0[2] = 0.0;
  afStack_1a0[3] = 0.0;
  puStack_190 = &DAT_3f8000003f800000;
  deRandom_init((deRandom *)&local_1cc,pTVar7->m_iteration * 1000 + pTVar7->m_primitive + 0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_288,6);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_218,6);
  if (0 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4)) {
    lVar20 = 0;
    uVar23 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar23;
      fVar24 = deRandom_getFloat((deRandom *)&local_1cc);
      *(float *)((long)(float *)local_288._0_8_ + lVar20) = fVar24 * 1.8 + -0.9;
      fVar24 = deRandom_getFloat((deRandom *)&local_1cc);
      *(float *)((long)(float *)local_288._0_8_ + lVar20 + 4) = fVar24 * 1.8 + -0.9;
      *(undefined4 *)((long)(float *)local_288._0_8_ + lVar20 + 8) = 0;
      fVar24 = 1.0;
      if (pTVar7->m_projective == true) {
        fVar24 = deRandom_getFloat((deRandom *)&local_1cc);
        fVar24 = fVar24 * 3.8 + 0.2;
        *(float *)((long)(float *)local_288._0_8_ + lVar20) =
             *(float *)((long)(float *)local_288._0_8_ + lVar20) * fVar24;
        *(float *)((long)(float *)local_288._0_8_ + lVar20 + 4) =
             *(float *)((long)(float *)local_288._0_8_ + lVar20 + 4) * fVar24;
        *(float *)((long)(float *)local_288._0_8_ + lVar20 + 8) =
             *(float *)((long)(float *)local_288._0_8_ + lVar20 + 8) * fVar24;
      }
      *(float *)((long)(float *)local_288._0_8_ + lVar20 + 0xc) = fVar24;
      uVar18 = *(undefined8 *)
                ((long)(local_1b8 +
                       lVar20 + (SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe
                                ) * -0x18) + 8);
      puVar12 = (undefined8 *)((long)(float *)local_218._0_8_ + lVar20);
      *puVar12 = *(undefined8 *)
                  (local_1b8 +
                  lVar20 + (SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                           -0x18);
      puVar12[1] = uVar18;
      uVar23 = uVar23 + 1;
      lVar20 = lVar20 + 0x10;
    } while ((long)uVar23 < (long)(int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4));
  }
  GVar5 = pTVar7->m_primitive;
  if (GVar5 == 4) {
    if (0 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4) + -2) {
      iVar10 = 0;
      do {
        local_1b8 = *(undefined1 (*) [8])((pointer)(local_288._0_8_ + (long)iVar10 * 0x10))->m_data;
        apSStack_1b0[0] =
             *(pointer *)(((pointer)(local_288._0_8_ + (long)iVar10 * 0x10))->m_data + 2);
        apSStack_1b0[1] =
             *(pointer *)((pointer)(local_288._0_8_ + (long)(iVar10 + 1) * 0x10))->m_data;
        afStack_1a0._0_8_ =
             *(undefined8 *)(((pointer)(local_288._0_8_ + (long)(iVar10 + 1) * 0x10))->m_data + 2);
        afStack_1a0._8_8_ =
             *(undefined8 *)((pointer)(local_288._0_8_ + (long)(iVar10 + 2) * 0x10))->m_data;
        puStack_190 = *(undefined1 **)
                       (((pointer)(local_288._0_8_ + (long)(iVar10 + 2) * 0x10))->m_data + 2);
        local_158[0] = false;
        local_158[1] = false;
        local_158[2] = false;
        local_188 = *(float (*) [2])((pointer)(local_218._0_8_ + (long)iVar10 * 0x10))->m_data;
        afStack_180 = *(float (*) [2])
                       (((pointer)(local_218._0_8_ + (long)iVar10 * 0x10))->m_data + 2);
        local_178 = *(float (*) [2])((pointer)(local_218._0_8_ + (long)(iVar10 + 1) * 0x10))->m_data
        ;
        afStack_170 = *(float (*) [2])
                       (((pointer)(local_218._0_8_ + (long)(iVar10 + 1) * 0x10))->m_data + 2);
        local_168 = *(float (*) [2])((pointer)(local_218._0_8_ + (long)(iVar10 + 2) * 0x10))->m_data
        ;
        afStack_160 = *(float (*) [2])
                       (((pointer)(local_218._0_8_ + (long)(iVar10 + 2) * 0x10))->m_data + 2);
        std::
        vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     *)local_248,(value_type *)local_1b8);
        iVar10 = iVar10 + 3;
      } while (iVar10 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4) + -2);
    }
  }
  else if (GVar5 == 5) {
    if (0 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4) + -2) {
      lVar21 = 0x200000000;
      lVar22 = 0x10;
      lVar20 = 0;
      do {
        pfVar4 = (float *)((long)((pointer)(local_288._0_8_ + -0x10))->m_data + lVar22);
        local_1b8 = *(undefined1 (*) [8])pfVar4;
        apSStack_1b0[0] = *(pointer *)(pfVar4 + 2);
        pfVar4 = (float *)((long)(float *)local_288._0_8_ + lVar22);
        apSStack_1b0[1] = *(pointer *)pfVar4;
        afStack_1a0._0_8_ = *(undefined8 *)(pfVar4 + 2);
        pfVar4 = (float *)((long)(float *)local_288._0_8_ + (lVar21 >> 0x1c));
        afStack_1a0._8_8_ = *(undefined8 *)pfVar4;
        puStack_190 = *(undefined1 **)(pfVar4 + 2);
        local_158[0] = false;
        local_158[1] = false;
        local_158[2] = false;
        pfVar4 = (float *)((long)((pointer)(local_218._0_8_ + -0x10))->m_data + lVar22);
        local_188 = *(float (*) [2])pfVar4;
        afStack_180 = *(float (*) [2])(pfVar4 + 2);
        pfVar4 = (float *)((long)(float *)local_218._0_8_ + lVar22);
        local_178 = *(float (*) [2])pfVar4;
        afStack_170 = *(float (*) [2])(pfVar4 + 2);
        pfVar4 = (float *)((long)(float *)local_218._0_8_ + (lVar21 >> 0x1c));
        local_168 = *(float (*) [2])pfVar4;
        afStack_160 = *(float (*) [2])(pfVar4 + 2);
        std::
        vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     *)local_248,(value_type *)local_1b8);
        lVar20 = lVar20 + 1;
        lVar21 = lVar21 + 0x100000000;
        lVar22 = lVar22 + 0x10;
      } while (lVar20 < (local_288._8_8_ - local_288._0_8_) * 0x10000000 + -0x200000000 >> 0x20);
    }
  }
  else if ((GVar5 == 6) && (1 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4) + -1)) {
    lVar20 = 1;
    lVar21 = 0x20;
    do {
      local_1b8 = *(undefined1 (*) [8])(float *)local_288._0_8_;
      apSStack_1b0[0] = *(pointer *)((float *)local_288._0_8_ + 2);
      pfVar4 = (float *)((long)((pointer)(local_288._0_8_ + -0x10))->m_data + lVar21);
      apSStack_1b0[1] = *(pointer *)pfVar4;
      afStack_1a0._0_8_ = *(undefined8 *)(pfVar4 + 2);
      pfVar4 = (float *)((long)(float *)local_288._0_8_ + lVar21);
      afStack_1a0._8_8_ = *(undefined8 *)pfVar4;
      puStack_190 = *(undefined1 **)(pfVar4 + 2);
      local_158[0] = false;
      local_158[1] = false;
      local_158[2] = false;
      local_188 = *(float (*) [2])(float *)local_218._0_8_;
      afStack_180 = *(float (*) [2])((float *)local_218._0_8_ + 2);
      pfVar4 = (float *)((long)((pointer)(local_218._0_8_ + -0x10))->m_data + lVar21);
      local_178 = *(float (*) [2])pfVar4;
      afStack_170 = *(float (*) [2])(pfVar4 + 2);
      pfVar4 = (float *)((long)(float *)local_218._0_8_ + lVar21);
      local_168 = *(float (*) [2])pfVar4;
      afStack_160 = *(float (*) [2])(pfVar4 + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)local_248,(value_type *)local_1b8);
      lVar20 = lVar20 + 1;
      lVar21 = lVar21 + 0x10;
    } while (lVar20 < (local_288._8_8_ - local_288._0_8_) * 0x10000000 + -0x100000000 >> 0x20);
  }
  local_1b8 = (undefined1  [8])
              ((local_220->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)apSStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)apSStack_1b0,"Generated vertices:",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)apSStack_1b0);
  std::ios_base::~ios_base(local_140);
  if (0 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4)) {
    lVar20 = 0;
    lVar21 = 0;
    do {
      local_1b8 = (undefined1  [8])
                  ((local_220->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                  .m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)apSStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)apSStack_1b0,"\t",1);
      tcu::operator<<((ostream *)apSStack_1b0,
                      (Vector<float,_4> *)((long)(float *)local_288._0_8_ + lVar20));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)apSStack_1b0,",\tcolor= ",9);
      tcu::operator<<((ostream *)apSStack_1b0,
                      (Vector<float,_4> *)((long)(float *)local_218._0_8_ + lVar20));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)apSStack_1b0);
      std::ios_base::~ios_base(local_140);
      lVar21 = lVar21 + 1;
      lVar20 = lVar20 + 0x10;
    } while (lVar21 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4));
  }
  pTVar7 = local_220;
  BaseRenderingCase::drawPrimitives
            (&local_220->super_BaseRenderingCase,(Surface *)&local_268,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_288,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_218,
             local_220->m_primitive);
  local_1b8 = (undefined1  [8])0x0;
  apSStack_1b0[0] = (pointer)0x0;
  apSStack_1b0[1] = (pointer)0x0;
  local_1cc.numSamples = (pTVar7->super_BaseRenderingCase).m_numSamples;
  local_1cc.subpixelBits = (pTVar7->super_BaseRenderingCase).m_subpixelBits;
  pRVar13 = Context::getRenderTarget((pTVar7->super_BaseRenderingCase).super_TestCase.m_context);
  local_1cc.redBits = (pRVar13->m_pixelFormat).redBits;
  pRVar13 = Context::getRenderTarget((pTVar7->super_BaseRenderingCase).super_TestCase.m_context);
  local_1cc.greenBits = (pRVar13->m_pixelFormat).greenBits;
  pRVar13 = Context::getRenderTarget((pTVar7->super_BaseRenderingCase).super_TestCase.m_context);
  pSVar19 = apSStack_1b0[1];
  pSVar1 = apSStack_1b0[0];
  auVar8 = local_1b8;
  local_1cc.blueBits = (pRVar13->m_pixelFormat).blueBits;
  local_1b8 = (undefined1  [8])local_248._0_8_;
  apSStack_1b0[0] = (pointer)local_248._8_8_;
  apSStack_1b0[1] = (pointer)local_248._16_8_;
  local_248._0_8_ = auVar8;
  local_248._8_8_ = pSVar1;
  local_248._16_8_ = pSVar19;
  bVar9 = tcu::verifyTriangleGroupInterpolation
                    ((Surface *)&local_268,(TriangleSceneSpec *)local_1b8,&local_1cc,
                     ((pTVar7->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                     .m_testCtx)->m_log);
  if (!bVar9) {
    pTVar7->m_allIterationsPassed = false;
  }
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,(long)apSStack_1b0[1] - (long)local_1b8);
  }
  iVar10 = pTVar7->m_iteration + 1;
  pTVar7->m_iteration = iVar10;
  IVar17 = CONTINUE;
  if (iVar10 == pTVar7->m_iterationCount) {
    description = "Found invalid pixel values";
    if (pTVar7->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar17 = STOP;
    tcu::TestContext::setTestResult
              ((pTVar7->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,pTVar7->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
  }
  if ((pointer)local_288._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ - local_288._0_8_);
  }
  tcu::Surface::~Surface((Surface *)&local_268);
  tcu::TestLog::endSection(local_1d8.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return IVar17;
}

Assistant:

TriangleInterpolationTest::IterateResult TriangleInterpolationTest::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<tcu::Vec4>							colorBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractTriangles(triangles, drawBuffer, colorBuffer);

	// log
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (!verifyTriangleGroupInterpolation(resultImage, scene, args, m_testCtx.getLog()))
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");

		return STOP;
	}
	else
		return CONTINUE;
}